

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O1

void __thiscall cursespp::ListOverlay::UpdateContents(ListOverlay *this)

{
  int iVar1;
  long lVar2;
  string local_38;
  undefined4 extraout_var;
  
  iVar1 = (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
            _vptr_IOrderable[0x23])();
  if ((((char)iVar1 != '\0') && (0 < this->width)) && (0 < this->height)) {
    iVar1 = (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable
              ._vptr_IOrderable[0x22])(this);
    lVar2 = CONCAT44(extraout_var,iVar1);
    if ((this->title)._M_string_length != 0) {
      wmove(lVar2,0,1);
      wattr_on(lVar2,0x200000,0);
      if (lVar2 != 0) {
        text::Align(&local_38,&this->title,AlignCenter,(long)this->width - 4);
        wprintw(lVar2,"%s",local_38._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
      }
      wattr_off(lVar2,0x200000,0);
    }
  }
  return;
}

Assistant:

void ListOverlay::UpdateContents() {
    if (!this->IsVisible() || this->width <= 0 || this->height <= 0) {
        return;
    }

    WINDOW* c = this->GetContent();

    const int currentX = 1;
    int currentY = 0;

    if (this->title.size()) {
        wmove(c, currentY, currentX);
        wattron(c, A_BOLD);
        checked_wprintw(c, "%s", text::Align(this->title, text::AlignCenter, this->width - 4).c_str());
        wattroff(c, A_BOLD);
        currentY += 2;
    }
}